

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O0

void gimage::clipRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  int iVar1;
  long lVar2;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  float in_XMM0_Da;
  store_t_conflict sVar3;
  float in_XMM1_Da;
  float v;
  long i;
  long k;
  int d;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDI);
    if (iVar1 <= local_14) break;
    local_20 = 0;
    while( true ) {
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI);
      if (lVar2 <= local_20) break;
      local_28 = 0;
      while( true ) {
        lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI);
        if (lVar2 <= local_28) break;
        sVar3 = Image<float,_gimage::PixelTraits<float>_>::get(in_RDI,local_28,local_20,local_14);
        if (sVar3 < in_XMM0_Da) {
          Image<float,_gimage::PixelTraits<float>_>::set
                    (in_RDI,local_28,local_20,local_14,in_XMM0_Da);
        }
        if (in_XMM1_Da < sVar3) {
          Image<float,_gimage::PixelTraits<float>_>::set
                    (in_RDI,local_28,local_20,local_14,in_XMM1_Da);
        }
        local_28 = local_28 + 1;
      }
      local_20 = local_20 + 1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void clipRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);
        if (v < from) image.set(i, k, d, from);
        if (v > to) image.set(i, k, d, to);
      }
    }
  }
}